

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Drop * __thiscall wasm::Builder::makeDrop(Builder *this,Expression *value)

{
  Drop *this_00;
  
  this_00 = (Drop *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
  this_00->value = value;
  Drop::finalize(this_00);
  return this_00;
}

Assistant:

Drop* makeDrop(Expression* value) {
    auto* ret = wasm.allocator.alloc<Drop>();
    ret->value = value;
    ret->finalize();
    return ret;
  }